

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti_wrap.cxx
# Opt level: O0

void SWIG_JavaException(JNIEnv *jenv,int code,char *msg)

{
  undefined4 in_ESI;
  undefined8 in_RDI;
  JNIEnv *unaff_retaddr;
  SWIG_JavaExceptionCodes exception_code;
  undefined4 in_stack_fffffffffffffff0;
  
  switch(in_ESI) {
  case 0xfffffff4:
    break;
  case 0xfffffff6:
  case 0xfffffffd:
    break;
  case 0xfffffff7:
  case 0xfffffff8:
  case 0xfffffffb:
    break;
  case 0xfffffff9:
  case 0xfffffffc:
    break;
  case 0xfffffffa:
    break;
  case 0xfffffffe:
    break;
  case 0xffffffff:
  default:
  }
  SWIG_JavaThrowException
            (unaff_retaddr,(SWIG_JavaExceptionCodes)((ulong)in_RDI >> 0x20),
             (char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  return;
}

Assistant:

SWIGINTERN void SWIG_JavaException(JNIEnv *jenv, int code, const char *msg) {
  SWIG_JavaExceptionCodes exception_code = SWIG_JavaUnknownError;
  switch(code) {
  case SWIG_MemoryError:
    exception_code = SWIG_JavaOutOfMemoryError;
    break;
  case SWIG_IOError:
    exception_code = SWIG_JavaIOException;
    break;
  case SWIG_SystemError:
  case SWIG_RuntimeError:
    exception_code = SWIG_JavaRuntimeException;
    break;
  case SWIG_OverflowError:
  case SWIG_IndexError:
    exception_code = SWIG_JavaIndexOutOfBoundsException;
    break;
  case SWIG_DivisionByZero:
    exception_code = SWIG_JavaArithmeticException;
    break;
  case SWIG_SyntaxError:
  case SWIG_ValueError:
  case SWIG_TypeError:
    exception_code = SWIG_JavaIllegalArgumentException;
    break;
  case SWIG_UnknownError:
  default:
    exception_code = SWIG_JavaUnknownError;
    break;
  }
  SWIG_JavaThrowException(jenv, exception_code, msg);
}